

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_array.c
# Opt level: O2

void garray_read(_garray *x,t_symbol *filename)

{
  uint uVar1;
  _garray *x_00;
  int iVar2;
  _glist *x_01;
  _glist *x_02;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  int elemsize;
  int yonset;
  double f;
  char *bufptr;
  char buf [1000];
  int local_450;
  int local_44c;
  FILE *local_448;
  t_symbol *local_440;
  long local_438;
  _garray *local_430;
  double local_428;
  char *local_420;
  char local_418 [1000];
  
  x_01 = (_glist *)garray_getarray_floatonly(x,&local_44c,&local_450);
  if (x_01 == (_glist *)0x0) {
    pd_error((void *)0x0,"%s: needs floating-point \'y\' field",x->x_realname->s_name);
    return;
  }
  uVar1 = *(uint *)&(x_01->gl_obj).te_g.g_pd;
  x_02 = glist_getcanvas(x_01);
  iVar2 = canvas_open(x_02,filename->s_name,"",local_418,&local_420,1000,0);
  if ((iVar2 < 0) || (local_448 = fdopen(iVar2,"r"), local_448 == (FILE *)0x0)) {
    pd_error((void *)0x0,"%s: can\'t open",filename->s_name);
  }
  else {
    lVar5 = (long)local_450;
    local_438 = (long)local_44c;
    uVar3 = 0;
    if (0 < (int)uVar1) {
      uVar3 = (ulong)uVar1;
    }
    lVar6 = local_438 * 4;
    local_440 = filename;
    local_430 = x;
    for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      iVar2 = __isoc99_fscanf(local_448,"%lf",&local_428);
      if (iVar2 == 0) {
        post("%s: read %d elements into table of size %d",local_440->s_name,uVar4 & 0xffffffff,
             (ulong)uVar1);
        uVar3 = uVar4;
        break;
      }
      *(float *)((long)&((x_01->gl_obj).te_g.g_next)->g_pd + lVar6) = (float)local_428;
      lVar6 = lVar6 + lVar5;
    }
    x_00 = local_430;
    lVar6 = uVar3 * lVar5 + local_438 * 4;
    for (; (long)uVar3 < (long)(int)uVar1; uVar3 = uVar3 + 1) {
      *(undefined4 *)((long)&((x_01->gl_obj).te_g.g_next)->g_pd + lVar6) = 0;
      lVar6 = lVar6 + lVar5;
    }
    fclose(local_448);
    garray_redraw(x_00);
  }
  return;
}

Assistant:

static void garray_read(t_garray *x, t_symbol *filename)
{
    int nelem, filedesc, i;
    FILE *fd;
    char buf[MAXPDSTRING], *bufptr;
    int yonset, elemsize;
    t_array *array = garray_getarray_floatonly(x, &yonset, &elemsize);
    if (!array)
    {
        pd_error(0, "%s: needs floating-point 'y' field", x->x_realname->s_name);
        return;
    }
    nelem = array->a_n;
    if ((filedesc = canvas_open(glist_getcanvas(x->x_glist),
            filename->s_name, "", buf, &bufptr, MAXPDSTRING, 0)) < 0
                || !(fd = fdopen(filedesc, "r")))
    {
        pd_error(0, "%s: can't open", filename->s_name);
        return;
    }
    for (i = 0; i < nelem; i++)
    {
        double f;
        if (!fscanf(fd, "%lf", &f))
        {
            post("%s: read %d elements into table of size %d",
                filename->s_name, i, nelem);
            break;
        }
        else *((t_float *)(array->a_vec + elemsize * i) + yonset) = f;
    }
    while (i < nelem)
        *((t_float *)(array->a_vec +
            elemsize * i) + yonset) = 0, i++;
    fclose(fd);
    garray_redraw(x);
}